

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
AddProperty<Js::PropertyRecord_const*>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true> *this,
          DynamicObject *instance,PropertyRecord *propertyKey,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  Type *pTVar1;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  code *pcVar3;
  Var value_00;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this_00;
  bool bVar4;
  bool bVar5;
  ushort uVar6;
  PropertyIndex PVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  BigSimpleDictionaryTypeHandler *this_01;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSVar10;
  PropertyRecord **ppPVar11;
  SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true> *this_02;
  uint uVar12;
  undefined7 in_register_00000081;
  DynamicObject *pDVar13;
  PropertyRecord *local_70;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  PropertyValueInfo *local_60;
  Var local_58;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *local_50;
  PropertyRecord *local_48;
  PropertyRecord *propertyKey_local;
  uint local_38;
  ushort local_34 [4];
  unsigned_short index;
  
  local_38 = (uint)CONCAT71(in_register_00000081,attributes);
  descriptor = (SimpleDictionaryPropertyDescriptor<unsigned_short> *)
               (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr;
  local_60 = info;
  local_48 = propertyKey;
  bVar4 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    (*(BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                       **)(this + 0x18),&local_48,
                     (SimpleDictionaryPropertyDescriptor<unsigned_short> **)&local_70,
                     (int *)local_34);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xa6e,"(!propertyMap->TryGetReference(propertyKey, &descriptor))",
                                "!propertyMap->TryGetReference(propertyKey, &descriptor)");
    if (!bVar4) goto LAB_00df576a;
    *puVar9 = 0;
  }
  if (local_48->isNumeric == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xa70,"(!TPropertyKey_IsNumeric(propertyKey))",
                                "!TPropertyKey_IsNumeric(propertyKey)");
    if (!bVar4) goto LAB_00df576a;
    *puVar9 = 0;
  }
  if ((((DAT_015bf33c == '\x01') && (((byte)this[0x28] & 6) == 0)) && (0xf < (uint)local_48->pid))
     && (local_48->isSymbol == false)) {
    this_02 = (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true> *)
              ConvertToSimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::JavascriptString*,true>
                        (this,instance);
    BVar8 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>::
            AddProperty<Js::PropertyRecord_const*>
                      (this_02,instance,local_48,value,(PropertyAttributes)local_38,local_60,flags,
                       possibleSideEffects);
    return BVar8;
  }
  if (((flags & PropertyOperation_Force) == PropertyOperation_None) &&
     (bVar4 = DynamicTypeHandler::VerifyIsExtensible
                        ((DynamicTypeHandler *)this,(ScriptContext *)descriptor,
                         (flags & (PropertyOperation_ThrowIfNotExtensible|
                                  PropertyOperation_StrictMode)) != PropertyOperation_None), !bVar4)
     ) {
    return 0;
  }
  if (((byte)this[9] & 4) == 0) {
    pTVar1 = (instance->super_RecyclableObject).type.ptr;
    local_50 = (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *)
               this;
    if (*(char *)&pTVar1[1].javascriptLibrary.ptr == '\x01') {
      if ((((byte)this[9] & 0x10) != 0) ||
         (*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\x01')) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0xa93,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar4) goto LAB_00df576a;
        *puVar9 = 0;
      }
      DynamicObject::ChangeType(instance);
      local_50 = (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
                  *)this;
    }
  }
  else {
    local_50 = SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
               ConvertToNonSharedSimpleDictionaryType
                         ((SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
                           *)this,instance);
  }
  if (*(int *)(this + 0xc) <= (int)(uint)*(ushort *)(this + 0x2a)) {
    if (0xfffd < *(int *)(this + 0xc)) {
      this_01 = SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
                ConvertToBigSimpleDictionaryTypeHandler
                          ((SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
                            *)this,instance);
      BVar8 = SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
              AddProperty<Js::PropertyRecord_const*>
                        ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *)
                         this_01,instance,local_48,value,(PropertyAttributes)local_38,local_60,flags
                         ,possibleSideEffects);
      return BVar8;
    }
    SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
    EnsureSlotCapacity(local_50,instance);
  }
  this_00 = local_50;
  propertyKey_local = (PropertyRecord *)instance;
  if (value == (Var)0x0 && (char)((flags & PropertyOperation_SpecialValue) >> 4) == '\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xaaf,
                                "((flags & PropertyOperation_SpecialValue) != 0 || value != nullptr)"
                                ,"(flags & PropertyOperation_SpecialValue) != 0 || value != nullptr"
                               );
    if (!bVar4) goto LAB_00df576a;
    *puVar9 = 0;
  }
  if (((this_00->super_DynamicTypeHandler).flags & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xab0,"(!typeHandler->GetIsShared())","!typeHandler->GetIsShared()"
                               );
    if (!bVar4) goto LAB_00df576a;
    *puVar9 = 0;
  }
  pRVar2 = (this_00->singletonInstance).ptr;
  if ((pRVar2 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
     ((PropertyRecord *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef != propertyKey_local)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xab1,
                                "(typeHandler->singletonInstance == nullptr || typeHandler->singletonInstance->Get() == instance)"
                                ,
                                "typeHandler->singletonInstance == nullptr || typeHandler->singletonInstance->Get() == instance"
                               );
    if (!bVar4) goto LAB_00df576a;
    *puVar9 = 0;
  }
  pDVar13 = (DynamicObject *)propertyKey_local;
  local_58 = value;
  if ((flags & PropertyOperation_PreInit) == PropertyOperation_None) {
    bVar4 = false;
    if (((flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
         PropertyOperation_None) && (bVar4 = false, 0xf < (uint)local_48->pid)) {
      pRVar2 = (this_00->singletonInstance).ptr;
      if ((pRVar2 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) ||
         ((PropertyRecord *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef != propertyKey_local
         )) goto LAB_00df54e7;
      bVar4 = VarIs<Js::JavascriptFunction>(value);
      if (bVar4) {
        bVar4 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixMethodPropsPhase);
        bVar4 = !bVar4;
        pDVar13 = (DynamicObject *)propertyKey_local;
      }
      else {
        bVar4 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixDataPropsPhase);
        pDVar13 = (DynamicObject *)propertyKey_local;
        if (bVar4) {
          bVar4 = false;
        }
        else {
          bVar4 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps
                            ((DynamicObject *)propertyKey_local,local_48,value);
        }
      }
    }
  }
  else {
LAB_00df54e7:
    bVar4 = false;
  }
  if (((this_00->field_0x28 & 2) == 0) ||
     (bVar5 = SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_true>
              ::TryReuseDeletedPropertyIndex
                        ((SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_true>
                          *)this_00,pDVar13,local_34), !bVar5)) {
    uVar12 = local_38;
    local_34[0] = *(ushort *)(this + 0x2a);
    Add<Js::PropertyRecord_const*>
              ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true> *)
               this_00,local_48,(PropertyAttributes)local_38,
               (flags & PropertyOperation_PreInit) == PropertyOperation_None,bVar4,false,
               (ScriptContext *)descriptor);
  }
  else {
    pSVar10 = JsUtil::
              BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
              ::GetValueAt((this_00->propertyMap).ptr,(uint)local_34[0]);
    uVar6 = pSVar10->propertyIndex;
    if (pSVar10->propertyIndex != local_34[0]) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0xac0,
                                  "(typeHandler->propertyMap->GetValueAt(index).propertyIndex == index)"
                                  ,
                                  "typeHandler->propertyMap->GetValueAt(index).propertyIndex == index"
                                 );
      if (!bVar5) {
LAB_00df576a:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar9 = 0;
      uVar6 = local_34[0];
    }
    ppPVar11 = JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
               ::GetKeyAt((this_00->propertyMap).ptr,(uint)uVar6);
    local_70 = *ppPVar11;
    JsUtil::
    BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
    ::Remove((this_00->propertyMap).ptr,&local_70);
    uVar12 = local_38;
    Add<Js::PropertyRecord_const*>
              ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true> *)
               this_00,local_34[0],local_48,(PropertyAttributes)local_38,
               (flags & PropertyOperation_PreInit) == PropertyOperation_None,bVar4,false,
               (ScriptContext *)descriptor);
    pDVar13 = (DynamicObject *)propertyKey_local;
  }
  if ((uVar12 & 1) != 0) {
    DynamicObject::SetHasNoEnumerableProperties(pDVar13,false);
  }
  DynamicTypeHandler::SetSlotUnchecked(pDVar13,(uint)local_34[0],local_58);
  value_00 = local_58;
  if (bVar4 == false && (char)((flags & PropertyOperation_PreInit) >> 5) == '\0') {
    PVar7 = local_34[0];
    uVar12 = local_38;
    if (local_60 == (PropertyValueInfo *)0x0) goto LAB_00df566e;
  }
  else {
    if (local_60 == (PropertyValueInfo *)0x0) goto LAB_00df566e;
    PVar7 = 0xffff;
    uVar12 = 0;
  }
  local_60->m_instance = &pDVar13->super_RecyclableObject;
  local_60->m_propertyIndex = PVar7;
  local_60->m_attributes = (PropertyAttributes)uVar12;
  local_60->flags = InlineCacheNoFlags;
LAB_00df566e:
  uVar12 = local_48->pid;
  if (uVar12 != 0xffffffff) {
    if ((((local_50->super_DynamicTypeHandler).flags & 0x20) != 0) ||
       ((0xf < uVar12 &&
        (BVar8 = JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty
                           ((RecyclableObject *)propertyKey_local,uVar12), BVar8 != 0)))) {
      ScriptContext::InvalidateProtoCaches((ScriptContext *)descriptor,uVar12);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              ((DynamicTypeHandler *)this,(DynamicObject *)propertyKey_local,uVar12,value_00,
               possibleSideEffects);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::AddProperty(DynamicObject* instance, TPropertyKey propertyKey, Var value, PropertyAttributes attributes,
        PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
#if DBG
        // Only Assert that the propertyMap doesn't contain propertyKey if TMapKey is string and propertyKey is not a symbol.
        if (!TMapKey_IsJavascriptString<TMapKey>() || !TMapKey_IsSymbol(propertyKey, scriptContext))
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            Assert(!propertyMap->TryGetReference(propertyKey, &descriptor));
        }
        Assert(!TPropertyKey_IsNumeric(propertyKey));
#endif

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (CONFIG_FLAG(ForceStringKeyedSimpleDictionaryTypeHandler) &&
            !TMapKey_IsJavascriptString<TMapKey>() &&
            !isUnordered && !hasNamelessPropertyId &&
            !TPropertyKey_IsInternalPropertyId(propertyKey) &&
            !TMapKey_IsSymbol(propertyKey, scriptContext))
        {
            return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                ->AddProperty(instance, propertyKey, value, attributes, info, flags, possibleSideEffects);
        }
#endif

        if (IsNotExtensibleSupported)
        {
            bool isForce = (flags & PropertyOperation_Force) != 0;
            if (!isForce)
            {
                bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;
                if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                {
                    return FALSE;
                }
            }
        }

        SimpleDictionaryTypeHandlerBase * typeHandler = this;
        if (GetIsLocked())
        {
            typeHandler = ConvertToNonSharedSimpleDictionaryType(instance);
        }
        else if(instance->GetDynamicType()->GetIsLocked())
        {
            Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

            // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
            instance->ChangeType();
        }

        if (TMapKey_IsJavascriptString<TMapKey>() &&
            (TPropertyKey_IsInternalPropertyId(propertyKey) || TMapKey_IsSymbol(propertyKey, scriptContext)))
        {
            PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning from string keyed to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"));
            // String keyed type handler cannot store InternalPropertyRecords since they have no string representation
            return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, const PropertyRecord*, IsNotExtensibleSupported>(instance)
                ->AddProperty(instance, propertyKey, value, attributes, info, flags, possibleSideEffects);
        }

        // CONSIDER: Do this after TryReuseDeletedPropertyIndex. If we can reuse slots, no need to grow right now.
        if (this->GetSlotCapacity() <= nextPropertyIndex)
        {
            if (this->GetSlotCapacity() >= MaxPropertyIndexSize)
            {
                BigSimpleDictionaryTypeHandler* newTypeHandler = ConvertToBigSimpleDictionaryTypeHandler(instance);

                return newTypeHandler->AddProperty(instance, propertyKey, value, attributes, info, flags, possibleSideEffects);
            }

            typeHandler->EnsureSlotCapacity(instance);
        }

        Assert((flags & PropertyOperation_SpecialValue) != 0 || value != nullptr);
        Assert(!typeHandler->GetIsShared());
        Assert(typeHandler->singletonInstance == nullptr || typeHandler->singletonInstance->Get() == instance);
#if ENABLE_FIXED_FIELDS
        bool markAsInitialized = ((flags & PropertyOperation_PreInit) == 0);
        bool markAsFixed = markAsInitialized && !TPropertyKey_IsInternalPropertyId(propertyKey) && (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0 &&
            typeHandler->singletonInstance != nullptr && typeHandler->singletonInstance->Get() == instance
            && (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyKey, value)));
#else
        bool markAsInitialized = true;
        bool markAsFixed = false;
#endif
        TPropertyIndex index;
        if (typeHandler->isUnordered &&
            typeHandler->AsUnordered()->TryReuseDeletedPropertyIndex(instance, &index))
        {
            // We are reusing a deleted property index for the new property ID. Update the property map.
            Assert(typeHandler->propertyMap->GetValueAt(index).propertyIndex == index);
            TMapKey deletedPropertyKey = typeHandler->propertyMap->GetKeyAt(index);
            typeHandler->propertyMap->Remove(deletedPropertyKey);
            typeHandler->Add(index, propertyKey, attributes, markAsInitialized, markAsFixed, false, scriptContext);
        }
        else
        {
            index = nextPropertyIndex;
            typeHandler->Add(propertyKey, attributes, markAsInitialized, markAsFixed, false, scriptContext);
        }

        if (attributes & PropertyEnumerable)
        {
            instance->SetHasNoEnumerableProperties(false);
        }

        SetSlotUnchecked(instance, index, value);

        // It's ok to populate inline cache here even if this handler isn't shared yet, because we don't have property add
        // inline cache flavor for SimpleDictionaryTypeHandlers.  This ensures that a) no new instance reaches this handler
        // without us knowing, and b) the inline cache doesn't inadvertently become polymorphic.
        if (markAsInitialized && !markAsFixed)
        {
            SetPropertyValueInfoNonFixed(info, instance, index, attributes);
        }
        else
        {
            PropertyValueInfo::SetNoCache(info, instance);
        }

        PropertyId propertyId = TPropertyKey_GetOptionalPropertyId(scriptContext, propertyKey);
        if (propertyId != Constants::NoProperty)
        {
            if ((typeHandler->GetFlags() & IsPrototypeFlag)
                || (!IsInternalPropertyId(propertyId)
                && JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty(instance, propertyId)))
            {
                // We don't evolve dictionary types when adding a field, so we need to invalidate prototype caches.
                // We only have to do this though if the current type is used as a prototype, or the current property
                // is found on the prototype chain.
                scriptContext->InvalidateProtoCaches(propertyId);
            }
            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
        }
        return true;
    }